

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O3

void printRep(myRep *rep,int len)

{
  char *pcVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  _List_node_base *p_Var6;
  ofstream outFile;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  pcVar1 = catStrIntStr("/home/ws/zzZyj/data/rep/rep",1,".txt");
  std::ofstream::ofstream(&local_230,pcVar1,_S_out);
  iVar4 = 0;
  p_Var6 = (_List_node_base *)rep;
  while (p_Var6 = (((_List_base<Rep,_std::allocator<Rep>_> *)&p_Var6->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next, p_Var6 != (_List_node_base *)rep) {
    iVar4 = iVar4 + 1;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," cost[0]=",9);
    poVar2 = std::ostream::_M_insert<double>(*(double *)p_Var6[1]._M_next);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," cost[1]=",9);
    poVar2 = std::ostream::_M_insert<double>(*(double *)((long)p_Var6[1]._M_next + 8));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"Following is the x,y,z coordinary: ",0x23);
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    if (0 < len) {
      iVar3 = 1;
      lVar5 = 0;
      do {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = std::ostream::_M_insert<double>((double)(&(p_Var6[1]._M_prev)->_M_next)[lVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = std::ostream::_M_insert<double>((double)(&(p_Var6[1]._M_prev)->_M_prev)[lVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        poVar2 = std::ostream::_M_insert<double>((double)(&p_Var6[1]._M_prev[1]._M_next)[lVar5]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        lVar5 = lVar5 + 3;
        iVar3 = iVar3 + 1;
      } while ((int)lVar5 < len);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               "------------------------------------------------------------------",0x42);
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
    std::ostream::put((char)&local_230);
    std::ostream::flush();
  }
  operator_delete(pcVar1);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _system;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void printRep(myRep & rep, int len){
    int repNum=0;
    repNum++;
    char *filename;
    filename = catStrIntStr("/home/ws/zzZyj/data/rep/rep", repNum, ".txt");
    ofstream outFile(filename);
    myRep ::iterator it2;
    int rr=0;
    for (it2=rep.begin(); it2!= rep.end(); it2++){
        rr++;
        outFile <<  rr << " cost[0]=" << it2->Cost[0] << " cost[1]=" << it2->Cost[1] << endl;
        outFile << "Following is the x,y,z coordinary: "<< endl;
        for (int i=0; i<len; i+=3){
            outFile<< i/3+1 << " " << it2->addO_origin[i] << " " << it2->addO_origin[i+1] << " " << it2->addO_origin[i+2]<< endl;
        }
        outFile << "------------------------------------------------------------------"<< endl;
    }
    delete filename;
    outFile.close();
}